

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_utils.cpp
# Opt level: O2

string * PEGetPDBPath_abi_cxx11_(string *__return_storage_ptr__,void *data,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  allocator *paVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  if (((size < 0x40) || (*data != 0x5a4d)) ||
     (lVar7 = (long)*(int *)((long)data + 0x3c), *(int *)((long)data + lVar7) != 0x4550)) {
    paVar6 = &local_29;
  }
  else {
    uVar1 = *(uint *)((long)data + lVar7 + 0xbc);
    if (uVar1 == 0) {
      paVar6 = &local_2a;
    }
    else {
      lVar8 = (long)data + (ulong)*(ushort *)((long)data + lVar7 + 0x14) + lVar7 + 0x18;
      for (uVar9 = 0; uVar9 != *(ushort *)((long)data + lVar7 + 6); uVar9 = uVar9 + 1) {
        uVar2 = *(uint *)((long)data + lVar7 + 0xb8);
        uVar3 = *(uint *)(lVar8 + 0xc);
        if ((uVar3 <= uVar2) && (uVar1 + uVar2 <= *(int *)(lVar8 + 0x10) + uVar3)) {
          lVar4 = (ulong)*(uint *)(lVar8 + 0x14) - (ulong)uVar3;
          lVar11 = ((ulong)uVar2 + (ulong)*(uint *)(lVar8 + 0x14)) - (ulong)uVar3;
          for (lVar12 = 0; ((ulong)uVar1 / 0x1c) * 0x1c - lVar12 != 0; lVar12 = lVar12 + 0x1c) {
            if ((*(int *)((long)data + lVar12 + lVar11 + 0xc) == 2) &&
               (uVar10 = (ulong)*(uint *)((long)data + lVar12 + lVar11 + 0x14),
               *(int *)((long)data + uVar10 + lVar4) == 0x53445352)) {
              pcVar5 = (char *)((long)data + uVar10 + lVar4 + 0x18);
              paVar6 = &local_2b;
              goto LAB_0010a6e9;
            }
          }
        }
        lVar8 = lVar8 + 0x28;
      }
      paVar6 = &local_2c;
    }
  }
  pcVar5 = "";
LAB_0010a6e9:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,paVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string PEGetPDBPath(const void* data, size_t size)
{
    if (!PEIsValidFile(data, size))
        return "";

    const PE_IMAGE_DOS_HEADER* dosHeader = (const PE_IMAGE_DOS_HEADER*)data;
    const PE_IMAGE_NT_HEADERS* ntHeader = (PE_IMAGE_NT_HEADERS*)((const uint8_t*)data + dosHeader->ntHeader);

    const PE_IMAGE_DATA_DIRECTORY& debugDir = ntHeader->OptionalHeader.DataDirectory[IMAGE_DIRECTORY_ENTRY_DEBUG];
    if (debugDir.size == 0)
        return "";

    // find which section that is in
    const PE_IMAGE_SECTION_HEADER* section = IMAGE_FIRST_SECTION_IMPL(ntHeader);
    for (int i = 0; i < ntHeader->FileHeader.numberOfSections; ++i, ++section)
    {
        if ((debugDir.va < section->VirtualAddress) || (debugDir.va + debugDir.size > section->VirtualAddress + section->SizeOfRawData))
            continue; // not in this section

        const char* sectionBasePtr = (const char*)data + section->PointerToRawData - section->VirtualAddress;
        const PE_IMAGE_DEBUG_DIRECTORY* entries = (PE_IMAGE_DEBUG_DIRECTORY*)(sectionBasePtr + debugDir.va);
        size_t entryCount = debugDir.size / sizeof(PE_IMAGE_DEBUG_DIRECTORY);
        for (int ei = 0; ei < entryCount; ++ei)
        {
            if (entries[ei].Type == PE_IMAGE_DEBUG_TYPE_CODEVIEW)
            {
                const PE_DEBUGTYPE_CODEVIEW* info = (const PE_DEBUGTYPE_CODEVIEW*)(sectionBasePtr + entries[ei].AddressOfRawData);
                if (memcmp(&info->Signature, "RSDS", 4) == 0)
                {
                    return info->PdbFileName;
                }
            }
        }
    }

    return "";
}